

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# imstb_textedit.h
# Opt level: O1

int ImStb::stb_text_locate_coord(ImGuiInputTextState *str,float x,float y)

{
  ImWchar *text_begin;
  uint *puVar1;
  bool bVar2;
  uint uVar3;
  undefined1 in_R8B;
  int iVar4;
  uint uVar5;
  uint line_start_idx;
  int char_idx;
  float fVar6;
  ImVec2 IVar7;
  float fVar8;
  float fVar9;
  float fVar10;
  ImWchar *local_38;
  
  uVar3 = str->CurLenW;
  bVar2 = 0 < (int)uVar3;
  if ((int)uVar3 < 1) {
    line_start_idx = 0;
    IVar7.x = 0.0;
    IVar7.y = 0.0;
    iVar4 = 0;
  }
  else {
    fVar10 = 0.0;
    line_start_idx = 0;
    do {
      puVar1 = (str->TextW).Data;
      local_38 = (ImWchar *)0x0;
      text_begin = puVar1 + (int)line_start_idx;
      IVar7 = InputTextCalcTextSizeW
                        (text_begin,puVar1 + str->CurLenW,&local_38,(ImVec2 *)0x1,(bool)in_R8B);
      iVar4 = (int)((ulong)((long)local_38 - (long)text_begin) >> 2);
      if (iVar4 < 1) {
        return uVar3;
      }
      if ((y < fVar10) && (line_start_idx == 0)) {
        return 0;
      }
      fVar10 = fVar10 + IVar7.y;
      if (y < fVar10) break;
      line_start_idx = line_start_idx + iVar4;
      bVar2 = (int)line_start_idx < (int)uVar3;
    } while ((int)line_start_idx < (int)uVar3);
  }
  uVar5 = uVar3;
  if ((bVar2) && (uVar5 = line_start_idx, 0.0 <= x)) {
    if ((x < IVar7.x) && (0 < iVar4)) {
      char_idx = 0;
      fVar10 = 0.0;
      do {
        fVar6 = STB_TEXTEDIT_GETWIDTH(str,line_start_idx,char_idx);
        fVar8 = fVar10 + fVar6;
        fVar9 = fVar8;
        if (x < fVar8) {
          uVar3 = line_start_idx + 1;
          if (x < fVar6 * 0.5 + fVar10) {
            uVar3 = line_start_idx;
          }
          uVar3 = uVar3 + char_idx;
          fVar9 = fVar10;
        }
        if (x < fVar8) {
          return uVar3;
        }
        char_idx = char_idx + 1;
        fVar10 = fVar9;
      } while (iVar4 != char_idx);
    }
    uVar5 = iVar4 + line_start_idx;
    if ((uVar5 == 0 || SCARRY4(iVar4,line_start_idx) != (int)uVar5 < 0) ||
       ((str->TextW).Size < (int)uVar5)) {
      __assert_fail("i >= 0 && i < Size",
                    "/workspace/llm4binary/github/license_all_cmakelists_1510/gulrak[P]relive-client/thirdparty/imgui/imgui.h"
                    ,0x68c,
                    "const T &ImVector<unsigned int>::operator[](int) const [T = unsigned int]");
    }
    if ((str->TextW).Data[uVar5 - 1] == 10) {
      uVar5 = uVar5 - 1;
    }
  }
  return uVar5;
}

Assistant:

static int stb_text_locate_coord(STB_TEXTEDIT_STRING *str, float x, float y)
{
   StbTexteditRow r;
   int n = STB_TEXTEDIT_STRINGLEN(str);
   float base_y = 0, prev_x;
   int i=0, k;

   r.x0 = r.x1 = 0;
   r.ymin = r.ymax = 0;
   r.num_chars = 0;

   // search rows to find one that straddles 'y'
   while (i < n) {
      STB_TEXTEDIT_LAYOUTROW(&r, str, i);
      if (r.num_chars <= 0)
         return n;

      if (i==0 && y < base_y + r.ymin)
         return 0;

      if (y < base_y + r.ymax)
         break;

      i += r.num_chars;
      base_y += r.baseline_y_delta;
   }

   // below all text, return 'after' last character
   if (i >= n)
      return n;

   // check if it's before the beginning of the line
   if (x < r.x0)
      return i;

   // check if it's before the end of the line
   if (x < r.x1) {
      // search characters in row for one that straddles 'x'
      prev_x = r.x0;
      for (k=0; k < r.num_chars; ++k) {
         float w = STB_TEXTEDIT_GETWIDTH(str, i, k);
         if (x < prev_x+w) {
            if (x < prev_x+w/2)
               return k+i;
            else
               return k+i+1;
         }
         prev_x += w;
      }
      // shouldn't happen, but if it does, fall through to end-of-line case
   }

   // if the last character is a newline, return that. otherwise return 'after' the last character
   if (STB_TEXTEDIT_GETCHAR(str, i+r.num_chars-1) == STB_TEXTEDIT_NEWLINE)
      return i+r.num_chars-1;
   else
      return i+r.num_chars;
}